

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmnutils.h
# Opt level: O1

void __thiscall JSMNUtilsEx::JSMNUtilsEx(JSMNUtilsEx *this,string *errmsg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"jsmnutils error: ",errmsg);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_00107d90;
  return;
}

Assistant:

JSMNUtilsEx(std::string errmsg) :
        std::runtime_error("jsmnutils error: " + errmsg) {}